

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CaptureEmptySourceAndNoGroups
               (Program *program)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((program->source).ptr != (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbed,"(program->source == 0)","program->source == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::Recycler::WBSetBit((char *)program);
  (program->source).ptr = L"";
  Memory::RecyclerWriteBarrierManager::WriteBarrier(program);
  program->sourceLen = 0;
  program->numGroups = 1;
  return;
}

Assistant:

void Parser<P, IsLiteral>::CaptureEmptySourceAndNoGroups(Program* program)
    {
        Assert(program->source == 0);

        program->source = const_cast<Char*>(_u(""));
        program->sourceLen = 0;

        program->numGroups = 1;

        // Remaining to set during compilation: litbuf, litbufLen, numLoops, insts, instsLen, entryPointLabel
    }